

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype QtPrivate::count(QStringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QVarLengthArray<char16_t,_256LL> s;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (haystack.m_size < needle.m_size) {
    qVar2 = -1;
  }
  else {
    memset(&s,0xaa,0x218);
    qt_from_latin1_to_qvla(&s,needle);
    qVar2 = count(haystack,(QStringView)s.super_QVLABase<char16_t>.super_QVLABaseBase._8_16_,cs);
    QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(&s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QLatin1StringView needle, Qt::CaseSensitivity cs)
{
    if (haystack.size() < needle.size())
        return -1;

    QVarLengthArray<char16_t> s = qt_from_latin1_to_qvla(needle);
    return QtPrivate::count(haystack, QStringView(s.data(), s.size()), cs);
}